

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.hpp
# Opt level: O0

shared_ptr<void> __thiscall
pstore::storage::address_to_pointer_impl<pstore::storage,std::shared_ptr<void>>
          (storage *this,storage *storage,address addr)

{
  segment_type segment;
  offset_type oVar1;
  shared_ptr<void> *psVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<void> sVar4;
  __shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2> local_40;
  undefined1 local_30 [8];
  shared_ptr<void> segment_base;
  storage *storage_local;
  address addr_local;
  
  segment_base.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)storage;
  storage_local = (storage *)addr.a_;
  addr_local.a_ = (value_type)this;
  segment = address::segment((address *)&storage_local);
  psVar2 = storage::segment_base(storage,segment);
  std::shared_ptr<void>::shared_ptr((shared_ptr<void> *)local_30,psVar2);
  std::static_pointer_cast<unsigned_char,void>((shared_ptr<void> *)&local_40);
  peVar3 = std::__shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>::get(&local_40);
  oVar1 = address::offset((address *)&storage_local);
  std::shared_ptr<void>::shared_ptr<void>
            ((shared_ptr<void> *)this,(shared_ptr<void> *)local_30,peVar3 + oVar1);
  std::shared_ptr<unsigned_char>::~shared_ptr((shared_ptr<unsigned_char> *)&local_40);
  std::shared_ptr<void>::~shared_ptr((shared_ptr<void> *)local_30);
  sVar4.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar4.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<void>)sVar4.super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

inline auto storage::address_to_pointer_impl (Storage & storage, address const addr) noexcept
        -> ResultType {
        auto segment_base = storage.segment_base (addr.segment ());
        using uint8_type = typename inherit_const<Storage, std::uint8_t>::type;
        return {segment_base,
                std::static_pointer_cast<uint8_type> (segment_base).get () + addr.offset ()};
    }